

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void jx9HashmapExtractNodeValue(jx9_hashmap_node *pNode,jx9_value *pValue,int bStore)

{
  jx9_value *pSrc;
  
  pSrc = HashmapExtractNodeValue(pNode);
  if (pSrc == (jx9_value *)0x0) {
    jx9MemObjRelease(pValue);
    return;
  }
  if (bStore != 0) {
    jx9MemObjStore(pSrc,pValue);
    return;
  }
  jx9MemObjLoad(pSrc,pValue);
  return;
}

Assistant:

JX9_PRIVATE void jx9HashmapExtractNodeValue(jx9_hashmap_node *pNode, jx9_value *pValue, int bStore)
{
	jx9_value *pEntry = HashmapExtractNodeValue(pNode);
	if( pEntry ){
		if( bStore ){
			jx9MemObjStore(pEntry, pValue);
		}else{
			jx9MemObjLoad(pEntry, pValue);
		}
	}else{
		jx9MemObjRelease(pValue);
	}
}